

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ObjectField *
jsonnet::internal::ObjectField::Assert
          (Fodder *fodder1,AST *body,Fodder *op_fodder,AST *msg,Fodder *comma_fodder)

{
  Fodder *in_RSI;
  ObjectField *in_RDI;
  undefined4 local_198 [2];
  undefined4 local_190;
  undefined4 local_188;
  LocationRange *in_stack_fffffffffffffe80;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *this;
  ObjectField *fodder_l;
  Fodder *fodder1_00;
  Kind kind;
  ObjectField *this_00;
  Hide in_stack_ffffffffffffff20;
  AST *in_stack_ffffffffffffff38;
  Identifier *in_stack_ffffffffffffff40;
  LocationRange *in_stack_ffffffffffffff48;
  ArgParams *in_stack_ffffffffffffff50;
  Fodder *in_stack_ffffffffffffff60;
  AST *in_stack_ffffffffffffff68;
  AST *in_stack_ffffffffffffff70;
  Fodder *comma_fodder_00;
  
  fodder1_00 = (Fodder *)0x0;
  kind = ASSERT;
  fodder_l = in_RDI;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2191d3);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2191fc);
  comma_fodder_00 = fodder1_00;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x219225);
  LocationRange::LocationRange(in_stack_fffffffffffffe80);
  this_00 = (ObjectField *)0x0;
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             0x21925d);
  this = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)0x0;
  local_188 = 0;
  local_190 = 0;
  local_198[0] = 2;
  ObjectField(this_00,kind,fodder1_00,in_RSI,(Fodder *)fodder_l,(Fodder *)in_RDI,
              in_stack_ffffffffffffff20,SUB81((ulong)local_198 >> 0x38,0),
              SUB81((ulong)local_198 >> 0x30,0),in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
              in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,SUB81((ulong)local_198 >> 0x28,0),
              in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
              comma_fodder_00);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (this);
  LocationRange::~LocationRange((LocationRange *)0x21931d);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this);
  return fodder_l;
}

Assistant:

static ObjectField Assert(const Fodder &fodder1, AST *body, const Fodder &op_fodder, AST *msg,
                              const Fodder &comma_fodder)
    {
        return ObjectField(ASSERT,
                           fodder1,
                           Fodder{},
                           Fodder{},
                           Fodder{},
                           VISIBLE,
                           false,
                           false,
                           nullptr,
                           nullptr,
                           LocationRange(),
                           ArgParams{},
                           false,
                           op_fodder,
                           body,
                           msg,
                           comma_fodder);
    }